

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O3

int ecp_mod_p256(mbedtls_mpi *N)

{
  ulong *puVar1;
  mbedtls_mpi_uint *pmVar2;
  ushort uVar3;
  mbedtls_mpi_uint *pmVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  char cVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  
  iVar6 = mbedtls_mpi_grow(N,9);
  if (iVar6 == 0) {
    pmVar4 = N->p;
    uVar11 = pmVar4[4];
    uVar5 = (uint)uVar11;
    uVar18 = (uint)*pmVar4;
    uVar25 = uVar5 + uVar18;
    uVar15 = (uint)(uVar11 >> 0x20);
    uVar26 = uVar25 + uVar15;
    uVar8 = (uint)(pmVar4[5] >> 0x20);
    uVar27 = uVar26 - uVar8;
    uVar10 = (uint)pmVar4[6];
    uVar28 = uVar27 - uVar10;
    uVar13 = (uint)(pmVar4[6] >> 0x20);
    uVar29 = uVar28 - uVar13;
    uVar16 = (uint)pmVar4[7];
    cVar17 = ((((CARRY4(uVar25,uVar15) + CARRY4(uVar5,uVar18)) - (uVar26 < uVar8)) -
              (uVar27 < uVar10)) - (uVar28 < uVar13)) - (uVar29 < uVar16);
    uVar18 = (uint)cVar17;
    uVar25 = (uint)(*pmVar4 >> 0x20);
    if (cVar17 < '\0') {
      cVar17 = -(uVar25 < -uVar18);
    }
    else {
      cVar17 = CARRY4(uVar18,uVar25);
    }
    uVar27 = uVar18 + uVar25 + uVar15;
    uVar26 = (uint)pmVar4[5];
    uVar28 = uVar27 + uVar26;
    uVar19 = uVar28 - uVar10;
    uVar20 = uVar19 - uVar13;
    uVar21 = uVar20 - uVar16;
    uVar24 = (uint)(pmVar4[7] >> 0x20);
    cVar17 = ((((CARRY4(uVar18 + uVar25,uVar15) + cVar17 + CARRY4(uVar27,uVar26)) -
               (uVar28 < uVar10)) - (uVar19 < uVar13)) - (uVar20 < uVar16)) - (uVar21 < uVar24);
    *pmVar4 = CONCAT44(uVar21 - uVar24,uVar29 - uVar16);
    uVar25 = (uint)cVar17;
    uVar18 = (uint)pmVar4[1];
    if (cVar17 < '\0') {
      cVar17 = -(uVar18 < -uVar25);
    }
    else {
      cVar17 = CARRY4(uVar25,uVar18);
    }
    uVar27 = uVar25 + uVar18 + uVar26;
    uVar28 = uVar27 + uVar8;
    uVar29 = uVar28 - uVar13;
    uVar19 = uVar29 - uVar16;
    cVar17 = (((CARRY4(uVar25 + uVar18,uVar26) + cVar17 + CARRY4(uVar27,uVar8)) - (uVar28 < uVar13))
             - (uVar29 < uVar16)) - (uVar19 < uVar24);
    uVar25 = (uint)cVar17;
    uVar18 = (uint)(pmVar4[1] >> 0x20);
    if (cVar17 < '\0') {
      cVar17 = -(uVar18 < -uVar25);
    }
    else {
      cVar17 = CARRY4(uVar25,uVar18);
    }
    uVar27 = uVar25 + uVar18 + uVar8;
    uVar28 = uVar27 + uVar8;
    uVar29 = uVar28 + uVar10;
    uVar20 = uVar29 + uVar10;
    uVar21 = uVar20 + uVar13;
    uVar22 = uVar21 - uVar24;
    uVar23 = uVar22 - uVar5;
    cVar17 = (((CARRY4(uVar29,uVar10) +
                CARRY4(uVar27,uVar8) + cVar17 + CARRY4(uVar25 + uVar18,uVar8) +
                CARRY4(uVar28,uVar10) + CARRY4(uVar20,uVar13)) - (uVar21 < uVar24)) -
             (uVar22 < uVar5)) - (uVar23 < uVar15);
    pmVar4[1] = CONCAT44(uVar23 - uVar15,uVar19 - uVar24);
    uVar25 = (uint)cVar17;
    uVar18 = (uint)pmVar4[2];
    if (cVar17 < '\0') {
      cVar17 = -(uVar18 < -uVar25);
    }
    else {
      cVar17 = CARRY4(uVar25,uVar18);
    }
    uVar27 = uVar25 + uVar18 + uVar10;
    uVar28 = uVar27 + uVar10;
    uVar29 = uVar28 + uVar13;
    uVar19 = uVar29 + uVar13;
    uVar20 = uVar19 + uVar16;
    uVar21 = uVar20 - uVar15;
    cVar17 = ((CARRY4(uVar29,uVar13) +
               CARRY4(uVar27,uVar10) + cVar17 + CARRY4(uVar25 + uVar18,uVar10) +
               CARRY4(uVar28,uVar13) + CARRY4(uVar19,uVar16)) - (uVar20 < uVar15)) -
             (uVar21 < uVar26);
    uVar25 = (uint)cVar17;
    uVar18 = (uint)(pmVar4[2] >> 0x20);
    if (cVar17 < '\0') {
      cVar17 = -(uVar18 < -uVar25);
    }
    else {
      cVar17 = CARRY4(uVar25,uVar18);
    }
    uVar27 = uVar25 + uVar18 + uVar13;
    uVar28 = uVar27 + uVar13;
    uVar29 = uVar28 + uVar16;
    uVar19 = uVar29 + uVar16;
    uVar20 = uVar19 + uVar24;
    uVar22 = uVar20 - uVar26;
    cVar17 = ((CARRY4(uVar29,uVar16) +
               CARRY4(uVar27,uVar13) + cVar17 + CARRY4(uVar25 + uVar18,uVar13) +
               CARRY4(uVar28,uVar16) + CARRY4(uVar19,uVar24)) - (uVar20 < uVar26)) -
             (uVar22 < uVar8);
    pmVar4[2] = CONCAT44(uVar22 - uVar8,uVar21 - uVar26);
    uVar25 = (uint)cVar17;
    uVar18 = (uint)pmVar4[3];
    if (cVar17 < '\0') {
      cVar17 = -(uVar18 < -uVar25);
    }
    else {
      cVar17 = CARRY4(uVar25,uVar18);
    }
    uVar27 = uVar25 + uVar18 + uVar16;
    uVar28 = uVar27 + uVar16;
    uVar29 = uVar28 + uVar24;
    uVar19 = uVar29 + uVar24;
    uVar20 = uVar19 + uVar16;
    uVar21 = uVar20 + uVar13;
    uVar22 = uVar21 - uVar5;
    cVar17 = ((CARRY4(uVar19,uVar16) +
               CARRY4(uVar28,uVar24) +
               CARRY4(uVar25 + uVar18,uVar16) + cVar17 + CARRY4(uVar27,uVar16) +
               CARRY4(uVar29,uVar24) + CARRY4(uVar20,uVar13)) - (uVar21 < uVar5)) -
             (uVar22 < uVar15);
    uVar18 = (uint)cVar17;
    uVar16 = (uint)(pmVar4[3] >> 0x20);
    if (cVar17 < '\0') {
      cVar17 = -(uVar16 < -uVar18);
    }
    else {
      cVar17 = CARRY4(uVar18,uVar16);
    }
    uVar25 = uVar18 + uVar16 + uVar24;
    uVar27 = uVar25 + uVar24;
    uVar28 = uVar27 + uVar24;
    uVar29 = uVar28 + uVar5;
    uVar19 = uVar29 - uVar26;
    uVar20 = uVar19 - uVar8;
    uVar21 = uVar20 - uVar10;
    bVar14 = ((((CARRY4(uVar27,uVar24) +
                 CARRY4(uVar18 + uVar16,uVar24) + cVar17 + CARRY4(uVar25,uVar24) +
                CARRY4(uVar28,uVar5)) - (uVar29 < uVar26)) - (uVar19 < uVar8)) - (uVar20 < uVar10))
             - (uVar21 < uVar13);
    pmVar4[3] = CONCAT44(uVar21 - uVar13,uVar22 - uVar15);
    bVar9 = 0;
    if ('\0' < (char)bVar14) {
      bVar9 = bVar14;
    }
    pmVar4[4] = (ulong)bVar9 | uVar11 & 0xffffffff00000000;
    uVar3 = N->n;
    if (4 < uVar3) {
      uVar11 = 9;
      do {
        uVar12 = 0xffffffff;
        if (((int)uVar11 - 1U & 1) != 0) {
          uVar12 = 0xffffffff00000000;
        }
        puVar1 = (ulong *)((long)pmVar4 + (uVar11 & 0xfffffffffffffffe) * 4);
        *puVar1 = *puVar1 & uVar12;
        uVar11 = uVar11 + 1;
      } while ((uint)uVar3 + (uint)uVar3 != uVar11);
    }
    if ((char)bVar14 < '\0') {
      lVar7 = 0;
      do {
        pmVar4[lVar7] = ~pmVar4[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 5);
      uVar11 = 0;
      do {
        pmVar2 = pmVar4 + uVar11;
        *pmVar2 = *pmVar2 + 1;
        if (3 < uVar11) break;
        uVar11 = uVar11 + 1;
      } while (*pmVar2 == 0);
      N->s = -1;
      pmVar4[4] = pmVar4[4] - (long)(char)bVar14;
    }
  }
  return iVar6;
}

Assistant:

static int ecp_mod_p256(mbedtls_mpi *N)
{
    INIT(256);

    ADD(8); ADD(9);
    SUB(11); SUB(12); SUB(13); SUB(14);             NEXT;         // A0

    ADD(9); ADD(10);
    SUB(12); SUB(13); SUB(14); SUB(15);             NEXT;         // A1

    ADD(10); ADD(11);
    SUB(13); SUB(14); SUB(15);                        NEXT;       // A2

    ADD(11); ADD(11); ADD(12); ADD(12); ADD(13);
    SUB(15); SUB(8); SUB(9);                        NEXT;         // A3

    ADD(12); ADD(12); ADD(13); ADD(13); ADD(14);
    SUB(9); SUB(10);                                   NEXT;      // A4

    ADD(13); ADD(13); ADD(14); ADD(14); ADD(15);
    SUB(10); SUB(11);                                   NEXT;     // A5

    ADD(14); ADD(14); ADD(15); ADD(15); ADD(14); ADD(13);
    SUB(8); SUB(9);                                   NEXT;       // A6

    ADD(15); ADD(15); ADD(15); ADD(8);
    SUB(10); SUB(11); SUB(12); SUB(13);             LAST;         // A7

cleanup:
    return ret;
}